

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_create_shader_resources_for_active_variables
          (spvc_compiler compiler,spvc_resources *resources,spvc_set set)

{
  spvc_context_s *psVar1;
  spvc_context psVar2;
  bool bVar3;
  spvc_resources_s *this;
  pointer psVar4;
  pointer this_00;
  pointer local_1ad8;
  exception *e;
  allocator local_1a91;
  string local_1a90;
  undefined1 local_1a70 [8];
  ShaderResources accessed_resources;
  allocator local_59;
  string local_58;
  undefined1 local_31;
  unique_ptr<spvc_resources_s,_std::default_delete<spvc_resources_s>_> local_30;
  unique_ptr<spvc_resources_s,_std::default_delete<spvc_resources_s>_> res;
  spvc_set set_local;
  spvc_resources *resources_local;
  spvc_compiler compiler_local;
  
  res._M_t.super___uniq_ptr_impl<spvc_resources_s,_std::default_delete<spvc_resources_s>_>._M_t.
  super__Tuple_impl<0UL,_spvc_resources_s_*,_std::default_delete<spvc_resources_s>_>.
  super__Head_base<0UL,_spvc_resources_s_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvc_resources_s,_std::default_delete<spvc_resources_s>,_true,_true>)
       (__uniq_ptr_data<spvc_resources_s,_std::default_delete<spvc_resources_s>,_true,_true>)set;
  this = (spvc_resources_s *)operator_new(0xe10,(nothrow_t *)&std::nothrow);
  local_31 = 0;
  local_1ad8 = (pointer)0x0;
  if (this != (spvc_resources_s *)0x0) {
    local_31 = 1;
    spvc_resources_s::spvc_resources_s(this);
    local_1ad8 = this;
  }
  std::unique_ptr<spvc_resources_s,std::default_delete<spvc_resources_s>>::
  unique_ptr<std::default_delete<spvc_resources_s>,void>
            ((unique_ptr<spvc_resources_s,std::default_delete<spvc_resources_s>> *)&local_30,
             local_1ad8);
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  if (bVar3) {
    psVar2 = compiler->context;
    psVar4 = std::unique_ptr<spvc_resources_s,_std::default_delete<spvc_resources_s>_>::operator->
                       (&local_30);
    psVar4->context = psVar2;
    this_00 = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
              operator->(&compiler->compiler);
    spirv_cross::Compiler::get_shader_resources
              ((ShaderResources *)local_1a70,this_00,
               (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                *)((long)res._M_t.
                         super___uniq_ptr_impl<spvc_resources_s,_std::default_delete<spvc_resources_s>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvc_resources_s_*,_std::default_delete<spvc_resources_s>_>
                         .super__Head_base<0UL,_spvc_resources_s_*,_false>._M_head_impl + 8));
    psVar4 = std::unique_ptr<spvc_resources_s,_std::default_delete<spvc_resources_s>_>::operator->
                       (&local_30);
    bVar3 = spvc_resources_s::copy_resources(psVar4,(ShaderResources *)local_1a70);
    if (bVar3) {
      psVar4 = std::unique_ptr<spvc_resources_s,_std::default_delete<spvc_resources_s>_>::get
                         (&local_30);
      *resources = psVar4;
      psVar2 = compiler->context;
      std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
      unique_ptr<spvc_resources_s,std::default_delete<spvc_resources_s>,void>
                ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *
                 )&e,&local_30);
      spirv_cross::
      SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
      ::push_back(&psVar2->allocations,
                  (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                   *)&e);
      std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
      ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                   *)&e);
    }
    else {
      psVar4 = std::unique_ptr<spvc_resources_s,_std::default_delete<spvc_resources_s>_>::operator->
                         (&local_30);
      psVar1 = psVar4->context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1a90,"Out of memory.",&local_1a91);
      spvc_context_s::report_error(psVar1,&local_1a90);
      std::__cxx11::string::~string((string *)&local_1a90);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a91);
      compiler_local._4_4_ = SPVC_ERROR_OUT_OF_MEMORY;
    }
    accessed_resources.builtin_outputs.stack_storage.aligned_char[0x1b9] = '\0';
    accessed_resources.builtin_outputs.stack_storage.aligned_char[0x1ba] = '\0';
    accessed_resources.builtin_outputs.stack_storage.aligned_char[0x1bb] = '\0';
    accessed_resources.builtin_outputs.stack_storage.aligned_char[0x1b8] = !bVar3;
    spirv_cross::ShaderResources::~ShaderResources((ShaderResources *)local_1a70);
  }
  else {
    psVar1 = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"Out of memory.",&local_59);
    spvc_context_s::report_error(psVar1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    compiler_local._4_4_ = SPVC_ERROR_OUT_OF_MEMORY;
    accessed_resources.builtin_outputs.stack_storage.aligned_char[0x1b8] = '\x01';
    accessed_resources.builtin_outputs.stack_storage.aligned_char[0x1b9] = '\0';
    accessed_resources.builtin_outputs.stack_storage.aligned_char[0x1ba] = '\0';
    accessed_resources.builtin_outputs.stack_storage.aligned_char[0x1bb] = '\0';
  }
  std::unique_ptr<spvc_resources_s,_std::default_delete<spvc_resources_s>_>::~unique_ptr(&local_30);
  if (accessed_resources.builtin_outputs.stack_storage.aligned_char._440_4_ == 0) {
    compiler_local._4_4_ = SPVC_SUCCESS;
  }
  return compiler_local._4_4_;
}

Assistant:

spvc_result spvc_compiler_create_shader_resources_for_active_variables(spvc_compiler compiler, spvc_resources *resources,
                                                                       spvc_set set)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_resources_s> res(new (std::nothrow) spvc_resources_s);
		if (!res)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		res->context = compiler->context;
		auto accessed_resources = compiler->compiler->get_shader_resources(set->set);

		if (!res->copy_resources(accessed_resources))
		{
			res->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}
		*resources = res.get();
		compiler->context->allocations.push_back(std::move(res));
	}